

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopIsAndType(char *pSop)

{
  char cVar1;
  int iVar2;
  
  iVar2 = Abc_SopGetCubeNum(pSop);
  if (iVar2 == 1) {
    do {
      cVar1 = *pSop;
      if (cVar1 == ' ') {
        return (uint)(pSop[1] == '1');
      }
      pSop = pSop + 1;
    } while (cVar1 != '-');
  }
  return 0;
}

Assistant:

int Abc_SopIsAndType( char * pSop )
{
    char * pCur;
    if ( Abc_SopGetCubeNum(pSop) != 1 )
        return 0;
    for ( pCur = pSop; *pCur != ' '; pCur++ )
        if ( *pCur == '-' )
            return 0;
    if ( pCur[1] != '1' )
        return 0;
    return 1;
}